

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt * __thiscall llvm::APInt::operator*=(APInt *this,uint64_t RHS)

{
  APInt *pAVar1;
  uint srcParts;
  ulong uVar2;
  
  uVar2 = (ulong)this->BitWidth;
  pAVar1 = this;
  if (uVar2 < 0x41) {
    (this->U).VAL = RHS * (this->U).VAL;
  }
  else {
    srcParts = (uint)(uVar2 + 0x3f >> 6);
    tcMultiplyPart((this->U).pVal,(this->U).pVal,RHS,0,srcParts,srcParts,false);
    uVar2 = (ulong)this->BitWidth;
    if (0x40 < uVar2) {
      pAVar1 = (APInt *)((this->U).pVal + ((int)(uVar2 + 0x3f >> 6) - 1));
    }
  }
  (pAVar1->U).VAL = ((pAVar1->U).VAL << (-(char)uVar2 & 0x3fU)) >> (-(char)uVar2 & 0x3fU);
  return this;
}

Assistant:

APInt& APInt::operator*=(uint64_t RHS) {
  if (isSingleWord()) {
    U.VAL *= RHS;
  } else {
    unsigned NumWords = getNumWords();
    tcMultiplyPart(U.pVal, U.pVal, RHS, 0, NumWords, NumWords, false);
  }
  return clearUnusedBits();
}